

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody
          (VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58 [3];
  Message local_40;
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  int local_14;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *pVStack_10;
  int count;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *this_local;
  
  local_14 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&local_14;
  pVStack_10 = this;
  VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::__0>
            ((this->super_VisitFieldsTest).message_,(anon_class_8_1_a7c1402f *)&gtest_ar.message_);
  local_34 = CountAllMessageFieldsViaListFields
                       ((this->super_VisitFieldsTest).reflection_,
                        (this->super_VisitFieldsTest).message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"count",
             "CountAllMessageFieldsViaListFields(reflection_, *message_)",&local_14,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x71,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitMessageFieldsCountIncludesRepeatedElements) {
  int count = 0;
  VisitMessageFields(*message_, [&](const Message& msg) { ++count; });

  EXPECT_EQ(count, CountAllMessageFieldsViaListFields(reflection_, *message_));
}